

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

string * __thiscall minja::capitalize(string *__return_storage_ptr__,minja *this,string *s)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  string *extraout_RAX;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (s != (string *)0x0) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,this,this + (long)&s->_M_dataplus);
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    iVar2 = toupper((int)*pcVar1);
    *pcVar1 = (char)iVar2;
    return (string *)CONCAT44(extraout_var,iVar2);
  }
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,this,this);
  return extraout_RAX;
}

Assistant:

static std::string capitalize(const std::string & s) {
  if (s.empty()) return s;
  auto result = s;
  result[0] = std::toupper(result[0]);
  return result;
}